

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFontGlyphRangesBuilder::AddText(ImFontGlyphRangesBuilder *this,char *text,char *text_end)

{
  uint uVar1;
  int iVar2;
  char *in_RDX;
  char *in_RSI;
  int c_len;
  uint c;
  ImWchar in_stack_ffffffffffffffce;
  undefined4 in_stack_ffffffffffffffd0;
  uint local_1c;
  char *local_18;
  char *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  while( true ) {
    if (local_18 == (char *)0x0) {
      uVar1 = (uint)*local_10;
    }
    else {
      uVar1 = (uint)(local_10 < local_18);
    }
    if (uVar1 == 0) break;
    local_1c = 0;
    iVar2 = ImTextCharFromUtf8(&local_1c,local_10,local_18);
    local_10 = local_10 + iVar2;
    if (iVar2 == 0) {
      return;
    }
    if (local_1c < 0x10000) {
      AddChar((ImFontGlyphRangesBuilder *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
              in_stack_ffffffffffffffce);
    }
  }
  return;
}

Assistant:

void ImFontGlyphRangesBuilder::AddText(const char* text, const char* text_end)
{
    while (text_end ? (text < text_end) : *text)
    {
        unsigned int c = 0;
        int c_len = ImTextCharFromUtf8(&c, text, text_end);
        text += c_len;
        if (c_len == 0)
            break;
        if (c < 0x10000)
            AddChar((ImWchar)c);
    }
}